

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

void RunManyThreads(_func_void *fn,int count)

{
  anon_class_8_1_3fcf6586 local_40;
  function<void_(int)> local_38;
  int local_14;
  _func_void *p_Stack_10;
  int count_local;
  _func_void *fn_local;
  
  local_40.fn = fn;
  local_14 = count;
  p_Stack_10 = fn;
  std::function<void(int)>::function<RunManyThreads::__0,void>
            ((function<void(int)> *)&local_38,&local_40);
  RunMany(&local_38,local_14);
  std::function<void_(int)>::~function(&local_38);
  return;
}

Assistant:

void RunManyThreads(void (*fn)(), int count) {
    RunMany([fn] (int dummy) {
      fn();
    }, count);
  }